

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

bool __thiscall ON_RenderContent::ChildSlotOn(ON_RenderContent *this,wchar_t *child_slot_name)

{
  bool bVar1;
  wchar_t *pwVar2;
  ON_wString s;
  ON_wString local_110;
  ON_XMLVariant local_108;
  
  ON_wString::ON_wString((ON_wString *)&local_108,child_slot_name);
  ON_wString::operator+(&local_110,(wchar_t *)&local_108);
  ON_wString::~ON_wString((ON_wString *)&local_108);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_110);
  (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2d])(&local_108,this,pwVar2);
  bVar1 = ::ON_XMLVariant::AsBool(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ON_wString::~ON_wString(&local_110);
  return bVar1;
}

Assistant:

bool ON_RenderContent::ChildSlotOn(const wchar_t* child_slot_name) const
{
  const auto s = ON_wString(child_slot_name) + L"-" MAT_POSTFIX_ON;
  return GetParameter(s).AsBool();
}